

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

long __thiscall
duckdb::Interpolator<false>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<false> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  idx_t iVar1;
  duckdb *pdVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>_>_> __comp_01;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  undefined1 auVar9 [16];
  long result_1;
  string local_50;
  long local_30;
  
  bVar4 = this->desc;
  iVar7 = this->CRN;
  iVar8 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_50._M_dataplus._M_p = (pointer)accessor;
  local_50._M_string_length = (size_type)accessor;
  local_50.field_2._M_local_buf[0] = bVar4;
  if (iVar7 == iVar8) {
    if (iVar7 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar4;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar1,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    pdVar2 = (duckdb *)v_t[iVar7];
    bVar4 = TryCast::Operation<long,long>((int64_t)pdVar2,&local_30,false);
    if (!bVar4) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar2,auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (iVar8 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar4;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar8 = this->FRN;
      iVar7 = this->CRN;
      iVar6 = this->end;
    }
    local_50._M_dataplus._M_p = (pointer)accessor;
    local_50._M_string_length = (size_type)accessor;
    local_50.field_2._M_local_buf[0] = bVar4;
    if (iVar7 != iVar6 && iVar8 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar8 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar4;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>>
                (v_t + iVar8,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar8 = this->FRN;
    }
    pdVar2 = (duckdb *)v_t[iVar8];
    bVar4 = TryCast::Operation<long,long>((int64_t)pdVar2,&local_30,false);
    lVar3 = local_30;
    if (!bVar4) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar2,auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pdVar2 = (duckdb *)v_t[this->CRN];
    bVar4 = TryCast::Operation<long,long>((int64_t)pdVar2,&local_30,false);
    if (!bVar4) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar2,auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_30 = (long)((double)(local_30 - lVar3) *
                      (this->RN -
                      (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                     (double)lVar3);
  }
  return local_30;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}